

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool copyAndroidSources(Options *options)

{
  FILE *__stream;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  long in_RDI;
  long in_FS_OFFSET;
  Options *unaff_retaddr;
  QDir *in_stack_00000008;
  QDir *in_stack_00000010;
  QDir sourceDirectory;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  byte bVar4;
  QDir local_30 [32];
  undefined8 local_10;
  long lVar5;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x11799c);
  if (bVar1) {
    bVar4 = 1;
  }
  else {
    if ((*(byte *)(in_RDI + 1) & 1) != 0) {
      fprintf(_stdout,"Copying Android sources from project.\n");
    }
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QDir::QDir((QDir *)&local_10,(QString *)(in_RDI + 0x188));
    uVar2 = QDir::exists();
    __stream = _stderr;
    if ((uVar2 & 1) == 0) {
      QtPrivate::asString((QString *)(in_RDI + 0x188));
      QString::toLocal8Bit((QString *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8))
      ;
      pcVar3 = QByteArray::constData((QByteArray *)0x117a36);
      fprintf(__stream,"Cannot find android sources in %s",pcVar3);
      QByteArray::~QByteArray((QByteArray *)0x117a56);
      bVar4 = 0;
    }
    else {
      QDir::QDir(local_30,(QString *)(in_RDI + 0x1a0));
      bVar4 = copyFiles(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                        SUB81((ulong)lVar5 >> 0x38,0));
      QDir::~QDir(local_30);
    }
    QDir::~QDir((QDir *)&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool copyAndroidSources(const Options &options)
{
    if (options.androidSourceDirectory.isEmpty())
        return true;

    if (options.verbose)
        fprintf(stdout, "Copying Android sources from project.\n");

    QDir sourceDirectory(options.androidSourceDirectory);
    if (!sourceDirectory.exists()) {
        fprintf(stderr, "Cannot find android sources in %s", qPrintable(options.androidSourceDirectory));
        return false;
    }

    return copyFiles(sourceDirectory, QDir(options.outputDirectory), options, true);
}